

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O0

string * __thiscall
iDynTree::SixAxisForceTorqueSensor::toString_abi_cxx11_
          (SixAxisForceTorqueSensor *this,Model *param_2)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  LinkIndex LVar3;
  void *this_00;
  SixAxisForceTorqueSensor *in_RSI;
  string *in_RDI;
  stringstream ss;
  SixAxisForceTorqueSensor *in_stack_fffffffffffffd38;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Sensor ");
  (*(in_RSI->super_JointSensor).super_Sensor._vptr_Sensor[2])(local_1d0);
  poVar2 = std::operator<<(poVar2,local_1d0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1d0);
  poVar2 = std::operator<<(local_190," is attached to joint ");
  (*(in_RSI->super_JointSensor).super_Sensor._vptr_Sensor[9])(local_1f0);
  poVar2 = std::operator<<(poVar2,local_1f0);
  poVar2 = std::operator<<(poVar2," ( ");
  iVar1 = (*(in_RSI->super_JointSensor).super_Sensor._vptr_Sensor[10])();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2," ) ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1f0);
  poVar2 = std::operator<<(local_190," that connects  ");
  getFirstLinkName_abi_cxx11_(in_stack_fffffffffffffd38);
  poVar2 = std::operator<<(poVar2,local_210);
  poVar2 = std::operator<<(poVar2," ( ");
  LVar3 = getFirstLinkIndex(in_RSI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,LVar3);
  poVar2 = std::operator<<(poVar2," ) and ");
  getSecondLinkName_abi_cxx11_(in_stack_fffffffffffffd38);
  poVar2 = std::operator<<(poVar2,local_230);
  poVar2 = std::operator<<(poVar2," ( ");
  LVar3 = getSecondLinkIndex(in_RSI);
  this_00 = (void *)std::ostream::operator<<(poVar2,LVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string SixAxisForceTorqueSensor::toString(const Model&  /*model*/) const
{
    std::stringstream ss;

    ss << "Sensor " << this->getName() << std::endl;
    ss << " is attached to joint " << this->getParentJoint() << " ( " << this->getParentJointIndex() << " ) " << std::endl;
    ss << " that connects  " << this->getFirstLinkName() << " ( " << this->getFirstLinkIndex() << " ) and "
                             << this->getSecondLinkName() << " ( " << this->getSecondLinkIndex() << std::endl;

    return ss.str();
}